

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialog::selectFile(QFileDialog *this,QString *filename)

{
  QDialogPrivate *this_00;
  QLineEdit *this_01;
  QList_conflict *pQVar1;
  QUrl QVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  QItemSelectionModel *pQVar6;
  QPlatformDialogHelper *pQVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QStringView QVar9;
  QStringView QVar10;
  QUrl url;
  QFileInfo info;
  anon_union_24_3_e3d07ef4_for_data *local_c8;
  QString *pQStack_c0;
  long local_b8;
  QUrl local_b0;
  char16_t *local_a8;
  undefined8 local_a0;
  QString local_98;
  QString local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((filename->d).size == 0) goto LAB_004dcc75;
  this_00 = *(QDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  if ((this_00->nativeDialogInUse != false) ||
     (this_00[1].super_QWidgetPrivate.focus_child == (QWidget *)0x0)) {
    local_b0.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::QUrl(&local_b0);
    QFileInfo::QFileInfo((QFileInfo *)local_58.data,(QString *)filename);
    cVar3 = QFileInfo::isRelative();
    QFileInfo::~QFileInfo((QFileInfo *)local_58.data);
    if (cVar3 == '\0') {
      QUrl::fromLocalFile((QString *)local_58.data);
      QVar2.d = local_b0.d;
      local_b0.d = (QUrlPrivate *)local_58.shared;
      local_58.shared = (PrivateShared *)QVar2.d;
      QUrl::~QUrl((QUrl *)&local_58.shared);
    }
    else {
      QFileDialogOptions::initialDirectory();
      QVar2.d = local_b0.d;
      local_b0.d = (QUrlPrivate *)local_58.shared;
      local_58.shared = (PrivateShared *)QVar2.d;
      QUrl::~QUrl((QUrl *)&local_58.shared);
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QUrl::path(&local_58,&local_b0,0x7f00000);
      cVar3 = QString::endsWith((QChar)(char16_t)&local_58,0x2f);
      if (cVar3 == '\0') {
        QString::append((QChar)(char16_t)&local_58);
      }
      local_98.d.d = (Data *)&local_58;
      local_98.d.ptr = (char16_t *)filename;
      QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>
                (&local_78,(QStringBuilder<QString_&,_const_QString_&> *)&local_98);
      QUrl::setPath((QString *)&local_b0,(ParsingMode)&local_78);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
        }
      }
    }
    pQVar7 = QDialogPrivate::platformHelper(this_00);
    if (pQVar7 != (QPlatformDialogHelper *)0x0) {
      cVar3 = (**(code **)(*(long *)pQVar7 + 0xd0))(pQVar7);
      if (cVar3 != '\0') {
        (**(code **)(*(long *)pQVar7 + 0x98))(pQVar7);
      }
    }
    pQVar1 = (QList_conflict *)this_00[1].super_QWidgetPrivate.toolTip.d.ptr;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (storage_type_conflict *)0x0;
    local_58._16_8_ = (long *)0x0;
    QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl_const&>
              ((QMovableArrayOps<QUrl> *)&local_58,0,&local_b0);
    QList<QUrl>::end((QList<QUrl> *)&local_58);
    QFileDialogOptions::setInitiallySelectedFiles(pQVar1);
    QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_58);
    QUrl::~QUrl(&local_b0);
    goto LAB_004dcc75;
  }
  cVar3 = QDir::isRelativePath((QString *)filename);
  if (cVar3 == '\0') {
    local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_98,(QString *)filename);
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::absoluteDir();
    QDir::path();
    QDir::~QDir((QDir *)&local_78);
    QFileSystemModel::rootPath();
    bVar4 = 1;
    if (local_78.d.size == local_58._16_8_) {
      QVar9.m_data = local_78.d.ptr;
      QVar9.m_size = local_78.d.size;
      QVar10.m_data = (storage_type_conflict *)local_58._8_8_;
      QVar10.m_size = local_78.d.size;
      bVar4 = QtPrivate::equalStrings(QVar9,QVar10);
      bVar4 = bVar4 ^ 1;
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar4 != 0) {
      setDirectory(this,(QString *)&local_58);
    }
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_98);
  }
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModel::index
            ((QString *)&local_78,(int)*(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x20);
  pQVar6 = QAbstractItemView::selectionModel
                     (*(QAbstractItemView **)
                       &this_00[1].super_QWidgetPrivate.focus_child[3].super_QPaintDevice);
  (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6);
  if ((((this->super_QDialog).super_QWidget.data)->widget_attributes & 0x8000) != 0) {
    bVar5 = QWidget::hasFocus(*(QWidget **)
                               &this_00[1].super_QWidgetPrivate.focus_child[4].super_QPaintDevice);
    if (bVar5) goto LAB_004dcc75;
  }
  this_01 = *(QLineEdit **)&this_00[1].super_QWidgetPrivate.focus_child[4].super_QPaintDevice;
  bVar8 = (int)(local_78.d.d._4_4_ | (uint)local_78.d.d) < 0;
  bVar5 = (long *)local_78.d.size == (long *)0x0;
  if (bVar5 || bVar8) {
    if (*(long *)&this_00[1].super_QWidgetPrivate.field_0x20 == 0) {
      local_b0.d = (QUrlPrivate *)0x0;
      local_a8 = L"/";
      local_a0 = 1;
    }
    else {
      QFileSystemModel::rootPath();
    }
    local_c8 = (anon_union_24_3_e3d07ef4_for_data *)(filename->d).d;
    pQStack_c0 = (QString *)(filename->d).ptr;
    local_b8 = (filename->d).size;
    if (local_c8 != (anon_union_24_3_e3d07ef4_for_data *)0x0) {
      LOCK();
      *(int *)local_c8 = *(int *)local_c8 + 1;
      UNLOCK();
    }
    QFileInfo::QFileInfo((QFileInfo *)local_58.data,(QString *)&local_c8);
    cVar3 = QFileInfo::isRelative();
    QFileInfo::~QFileInfo((QFileInfo *)local_58.data);
    if (cVar3 == '\0') {
      cVar3 = QString::startsWith((QString *)&local_c8,(CaseSensitivity)&local_b0);
      if (cVar3 != '\0') {
        QString::remove((longlong)&local_c8,0);
      }
      if (local_b8 == 0) {
        local_98.d.d = (Data *)local_c8;
        local_98.d.ptr = (char16_t *)pQStack_c0;
        local_c8 = (anon_union_24_3_e3d07ef4_for_data *)0x0;
        pQStack_c0 = (QString *)0x0;
        local_98.d.size = 0;
        goto LAB_004dcbef;
      }
      if (*(short *)&(pQStack_c0->d).d == 0x2f) {
        QString::remove((longlong)&local_c8,0);
      }
      local_98.d.d = (Data *)local_c8;
      local_98.d.size = local_b8;
      local_98.d.ptr = (char16_t *)pQStack_c0;
    }
    else {
      local_98.d.d = (Data *)local_c8;
      local_98.d.ptr = (char16_t *)pQStack_c0;
      local_98.d.size = local_b8;
    }
    local_b8 = 0;
    pQStack_c0 = (QString *)0x0;
    local_c8 = (anon_union_24_3_e3d07ef4_for_data *)0x0;
  }
  else {
    (**(code **)(*(long *)local_78.d.size + 0x90))(&local_58,local_78.d.size,&local_78,0);
    ::QVariant::toString();
  }
LAB_004dcbef:
  QLineEdit::setText(this_01,&local_98);
  if ((anon_union_24_3_e3d07ef4_for_data *)local_98.d.d != (anon_union_24_3_e3d07ef4_for_data *)0x0)
  {
    LOCK();
    *(int *)local_98.d.d = *(int *)local_98.d.d + -1;
    UNLOCK();
    if (*(int *)local_98.d.d == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar5 || bVar8) {
    if (local_c8 != (anon_union_24_3_e3d07ef4_for_data *)0x0) {
      LOCK();
      *(int *)local_c8 = *(int *)local_c8 + -1;
      UNLOCK();
      if (*(int *)local_c8 == 0) {
        QArrayData::deallocate((QArrayData *)local_c8,2,0x10);
      }
    }
    if ((QArrayData *)local_b0.d != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_b0.d = *(int *)local_b0.d + -1;
      UNLOCK();
      if (*(int *)local_b0.d == 0) {
        QArrayData::deallocate((QArrayData *)local_b0.d,2,0x10);
      }
    }
  }
  else {
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
LAB_004dcc75:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::selectFile(const QString &filename)
{
    Q_D(QFileDialog);
    if (filename.isEmpty())
        return;

    if (!d->usingWidgets()) {
        QUrl url;
        if (QFileInfo(filename).isRelative()) {
            url = d->options->initialDirectory();
            QString path = url.path();
            if (!path.endsWith(u'/'))
                path += u'/';
            url.setPath(path + filename);
        } else {
            url = QUrl::fromLocalFile(filename);
        }
        d->selectFile_sys(url);
        d->options->setInitiallySelectedFiles(QList<QUrl>() << url);
        return;
    }

    if (!QDir::isRelativePath(filename)) {
        QFileInfo info(filename);
        QString filenamePath = info.absoluteDir().path();

        if (d->model->rootPath() != filenamePath)
            setDirectory(filenamePath);
    }

    QModelIndex index = d->model->index(filename);
    d->qFileDialogUi->listView->selectionModel()->clear();
    if (!isVisible() || !d->lineEdit()->hasFocus())
        d->lineEdit()->setText(index.isValid() ? index.data().toString() : fileFromPath(d->rootPath(), filename));
}